

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gensprep.c
# Opt level: O2

int main(int argc,char **argv)

{
  char *__s;
  char *__s_00;
  UOption *pUVar1;
  char *bundleName;
  FILE *pFVar2;
  uint argc_00;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  EVP_PKEY_CTX *__s_01;
  char *pcVar7;
  char *pcVar8;
  EVP_PKEY_CTX *pEVar9;
  int options;
  EVP_PKEY_CTX *ctx;
  UErrorCode errorCode;
  char *local_80;
  char *local_78 [9];
  
  errorCode = U_ZERO_ERROR;
  ::options[4].value = u_getDataDirectory_63();
  ::options[5].value = "";
  ::options[0xb].value = "0";
  ::options[7].value = "sprep";
  ::options[8].value = "";
  argc_00 = u_parseArgs(argc,argv,0xc,::options);
  bundleName = ::options[7].value;
  pcVar8 = ::options[5].value;
  if ((int)argc_00 < 0) {
    fprintf(_stderr,"error in command line argument \"%s\"\n",argv[-argc_00]);
  }
  else if ((::options[0].doesOccur == '\0') && (::options[1].doesOccur == '\0')) {
    beVerbose = ::options[2].doesOccur;
    haveCopyright = ::options[3].doesOccur;
    pUVar1 = ::options + 8;
    if (::options[8].doesOccur == '\0') {
      pUVar1 = ::options + 9;
    }
    if ((1 < argc_00) && (::options[0xb].doesOccur != '\0')) {
      local_80 = ::options[4].value;
      __s = pUVar1->value;
      __s_00 = argv[1];
      if (::options[6].doesOccur != '\0') {
        u_setDataDirectory_63(::options[6].value);
      }
      setUnicodeVersion(::options[0xb].value);
      sVar4 = strlen(pcVar8);
      sVar5 = strlen(__s_00);
      if (__s == (char *)0x0) {
        sVar6 = 0;
      }
      else {
        sVar6 = strlen(__s);
      }
      __s_01 = (EVP_PKEY_CTX *)uprv_malloc_63(sVar6 + sVar4 + sVar5 + 0x28);
      pcVar7 = strchr(pcVar8,0x2f);
      pEVar9 = __s_01;
      if (pcVar7 == (char *)0x0) {
        *(undefined2 *)__s_01 = 0x2f2e;
        pEVar9 = __s_01 + 2;
      }
      strcpy((char *)pEVar9,pcVar8);
      ctx = __s_01;
      sVar4 = strlen((char *)__s_01);
      pEVar9 = __s_01 + sVar4;
      if ((0 < (long)sVar4) && (pEVar9[-1] != (EVP_PKEY_CTX)0x2f)) {
        *pEVar9 = (EVP_PKEY_CTX)0x2f;
        pEVar9 = pEVar9 + 1;
      }
      init(ctx);
      strcpy((char *)pEVar9,__s_00);
      u_parseDelimitedFile
                ((char *)__s_01,';',(char *(*) [2])local_78,3,strprepProfileLineFn,__s_01,&errorCode
                );
      pFVar2 = _stderr;
      if (errorCode == U_FILE_ACCESS_ERROR || errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
        if (errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
          if (::options[8].doesOccur == '\0') {
            iVar3 = 0;
          }
          else {
            strcpy((char *)__s_01,__s);
            sVar4 = strlen((char *)__s_01);
            pEVar9 = __s_01 + sVar4;
            if ((0 < (long)sVar4) && (pEVar9[-1] != (EVP_PKEY_CTX)0x2f)) {
              *pEVar9 = (EVP_PKEY_CTX)0x2f;
              pEVar9 = pEVar9 + 1;
            }
            *pEVar9 = (EVP_PKEY_CTX)0x2f;
            *(undefined8 *)(pEVar9 + 1) = 0x7a696c616d726f4e;
            *(undefined8 *)(pEVar9 + 9) = 0x726f436e6f697461;
            *(undefined8 *)(pEVar9 + 0xe) = 0x6974636572726f43;
            *(undefined8 *)(pEVar9 + 0x16) = 0x7478742e736e6f;
            u_parseDelimitedFile
                      ((char *)__s_01,';',(char *(*) [2])local_78,4,normalizationCorrectionsLineFn,
                       (void *)0x0,&errorCode);
            if (errorCode != U_FILE_ACCESS_ERROR && U_ZERO_ERROR < errorCode) goto LAB_00109872;
            if (U_ZERO_ERROR < errorCode) {
              fprintf(_stderr,"Could not open file %s for reading \n",__s_01);
              return errorCode;
            }
            iVar3 = 1;
          }
          options = iVar3 + 2;
          if (::options[10].doesOccur == '\0') {
            options = iVar3;
          }
          setOptions(options);
          if (errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
            generateData(local_80,bundleName);
            cleanUpData();
          }
          uprv_free_63(__s_01);
          u_cleanup_63();
        }
        else {
          pcVar8 = u_errorName_63(errorCode);
          fprintf(pFVar2,"Could not open file %s for reading. Error: %s \n",__s_01,pcVar8);
        }
        return errorCode;
      }
LAB_00109872:
      pFVar2 = _stderr;
      pcVar8 = u_errorName_63(errorCode);
      fprintf(pFVar2,"gensprep error: u_parseDelimitedFile(\"%s\") failed - %s\n",__s_01,pcVar8);
      exit(errorCode);
    }
  }
  iVar3 = printHelp(argc_00,argv);
  return iVar3;
}

Assistant:

extern int
main(int argc, char* argv[]) {
#if !UCONFIG_NO_IDNA
    char* filename = NULL;
#endif
    const char *srcDir=NULL, *destDir=NULL, *icuUniDataDir=NULL;
    const char *bundleName=NULL, *inputFileName = NULL;
    char *basename=NULL;
    int32_t sprepOptions = 0;

    UErrorCode errorCode=U_ZERO_ERROR;

    U_MAIN_INIT_ARGS(argc, argv);

    /* preset then read command line options */
    options[DESTDIR].value=u_getDataDirectory();
    options[SOURCEDIR].value="";
    options[UNICODE_VERSION].value="0"; /* don't assume the unicode version */
    options[BUNDLE_NAME].value = DATA_NAME;
    options[NORMALIZE].value = "";

    argc=u_parseArgs(argc, argv, UPRV_LENGTHOF(options), options);

    /* error handling, printing usage message */
    if(argc<0) {
        fprintf(stderr,
            "error in command line argument \"%s\"\n",
            argv[-argc]);
    }
    if(argc<0 || options[HELP].doesOccur || options[HELP_QUESTION_MARK].doesOccur) {
        return printHelp(argc, argv);
        
    }

    /* get the options values */
    beVerbose=options[VERBOSE].doesOccur;
    haveCopyright=options[COPYRIGHT].doesOccur;
    srcDir=options[SOURCEDIR].value;
    destDir=options[DESTDIR].value;
    bundleName = options[BUNDLE_NAME].value;
    if(options[NORMALIZE].doesOccur) {
        icuUniDataDir = options[NORMALIZE].value;
    } else {
        icuUniDataDir = options[NORM_CORRECTION_DIR].value;
    }

    if(argc<2) {
        /* print the help message */
        return printHelp(argc, argv);
    } else {
        inputFileName = argv[1];
    }
    if(!options[UNICODE_VERSION].doesOccur){
        return printHelp(argc, argv);
    }
    if(options[ICUDATADIR].doesOccur) {
        u_setDataDirectory(options[ICUDATADIR].value);
    }
#if UCONFIG_NO_IDNA

    fprintf(stderr,
        "gensprep writes dummy " U_ICUDATA_NAME "_" DATA_NAME "." DATA_TYPE
        " because UCONFIG_NO_IDNA is set, \n"
        "see icu/source/common/unicode/uconfig.h\n");
    generateData(destDir, bundleName);

#else

    setUnicodeVersion(options[UNICODE_VERSION].value);
    filename = (char* ) uprv_malloc(uprv_strlen(srcDir) + uprv_strlen(inputFileName) + (icuUniDataDir == NULL ? 0 : uprv_strlen(icuUniDataDir)) + 40); /* hopefully this should be enough */
   
    /* prepare the filename beginning with the source dir */
    if(uprv_strchr(srcDir,U_FILE_SEP_CHAR) == NULL && uprv_strchr(srcDir,U_FILE_ALT_SEP_CHAR) == NULL){
        filename[0] = '.';
        filename[1] = U_FILE_SEP_CHAR;
        uprv_strcpy(filename+2,srcDir);
    }else{
        uprv_strcpy(filename, srcDir);
    }
    
    basename=filename+uprv_strlen(filename);
    if(basename>filename && *(basename-1)!=U_FILE_SEP_CHAR) {
        *basename++=U_FILE_SEP_CHAR;
    }
    
    /* initialize */
    init();

    /* process the file */
    uprv_strcpy(basename,inputFileName);
    parseMappings(filename,FALSE, &errorCode);
    if(U_FAILURE(errorCode)) {
        fprintf(stderr, "Could not open file %s for reading. Error: %s \n", filename, u_errorName(errorCode));
        return errorCode;
    }
    
    if(options[NORMALIZE].doesOccur){ /* this option might be set by @normalize;; in the source file */
        /* set up directory for NormalizationCorrections.txt */
        uprv_strcpy(filename,icuUniDataDir);
        basename=filename+uprv_strlen(filename);
        if(basename>filename && *(basename-1)!=U_FILE_SEP_CHAR) {
            *basename++=U_FILE_SEP_CHAR;
        }

        *basename++=U_FILE_SEP_CHAR;
        uprv_strcpy(basename,NORM_CORRECTIONS_FILE_NAME);
    
        parseNormalizationCorrections(filename,&errorCode);
        if(U_FAILURE(errorCode)){
            fprintf(stderr,"Could not open file %s for reading \n", filename);
            return errorCode;
        }
        sprepOptions |= _SPREP_NORMALIZATION_ON;
    }
    
    if(options[CHECK_BIDI].doesOccur){ /* this option might be set by @check-bidi;; in the source file */
        sprepOptions |= _SPREP_CHECK_BIDI_ON;
    }

    setOptions(sprepOptions);

    /* process parsed data */
    if(U_SUCCESS(errorCode)) {
        /* write the data file */
        generateData(destDir, bundleName);

        cleanUpData();
    }

    uprv_free(filename);

    u_cleanup();

#endif

    return errorCode;
}